

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_helpers.cc
# Opt level: O1

string * __thiscall
google::protobuf::compiler::javanano::GenerateGetBit_abi_cxx11_
          (string *__return_storage_ptr__,javanano *this,int bit_index)

{
  long lVar1;
  long *plVar2;
  long *plVar3;
  size_type *psVar4;
  uint uVar5;
  uint uVar6;
  string mask;
  string var_name;
  long *local_c0;
  long local_b8;
  long local_b0;
  long lStack_a8;
  long *local_a0;
  long local_98;
  long local_90;
  long lStack_88;
  long *local_80 [2];
  long local_70 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40;
  
  uVar6 = (uint)this;
  uVar5 = uVar6 + 0x1f;
  if (-1 < (int)uVar6) {
    uVar5 = uVar6;
  }
  GetBitFieldName_abi_cxx11_(&local_40,(javanano *)(ulong)(uint)((int)uVar5 >> 5),bit_index);
  std::__cxx11::string::string
            ((string *)local_80,
             *(char **)(kBitMasks + (long)(int)(uVar6 - (uVar5 & 0xffffffe0)) * 8),
             (allocator *)&local_c0);
  std::operator+(&local_60,"((",&local_40);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_60);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_90 = *plVar3;
    lStack_88 = plVar2[3];
    local_a0 = &local_90;
  }
  else {
    local_90 = *plVar3;
    local_a0 = (long *)*plVar2;
  }
  local_98 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::_M_append((char *)&local_a0,(ulong)local_80[0]);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_b0 = *plVar3;
    lStack_a8 = plVar2[3];
    local_c0 = &local_b0;
  }
  else {
    local_b0 = *plVar3;
    local_c0 = (long *)*plVar2;
  }
  local_b8 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_c0);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar4 = (size_type *)(plVar2 + 2);
  if ((size_type *)*plVar2 == psVar4) {
    lVar1 = plVar2[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar2;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
  }
  __return_storage_ptr__->_M_string_length = plVar2[1];
  *plVar2 = (long)psVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if (local_c0 != &local_b0) {
    operator_delete(local_c0,local_b0 + 1);
  }
  if (local_a0 != &local_90) {
    operator_delete(local_a0,local_90 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if (local_80[0] != local_70) {
    operator_delete(local_80[0],local_70[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

string GenerateGetBit(int bit_index) {
  string var_name = GetBitFieldNameForBit(bit_index);
  int bit_in_var_index = bit_index % 32;

  string mask = kBitMasks[bit_in_var_index];
  string result = "((" + var_name + " & " + mask + ") != 0)";
  return result;
}